

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseRAPass::runLocalAllocator(BaseRAPass *this)

{
  long lVar1;
  ArchTraits *pAVar2;
  ArchTraits *pAVar3;
  bool bVar4;
  bool bVar5;
  Error EVar6;
  RABlock **ppRVar7;
  uint32_t *puVar8;
  PhysToWorkMap **ppPVar9;
  RAAssignment *in_RDI;
  InstNode *in_stack_00000040;
  RALocalAllocator *in_stack_00000048;
  Error _err_9;
  Error _err_8;
  Error _err_7;
  BaseNode *prev;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  RABlock *cont;
  Error _err_2;
  RABlocks *successors;
  InstNode *inst;
  BaseNode *next;
  BaseNode *node;
  RABlock *consecutive;
  bool unconditionalJump;
  BaseNode *afterLast;
  BaseNode *beforeFirst;
  BaseNode *terminator;
  BaseNode *last;
  BaseNode *first;
  Error _err_1;
  RABlock *block;
  uint32_t blockId;
  uint32_t blocksRemaining;
  Error _err;
  RALocalAllocator lra;
  BaseRAPass *in_stack_fffffffffffffb38;
  RALocalAllocator *in_stack_fffffffffffffb40;
  RALocalAllocator *in_stack_fffffffffffffb48;
  RALocalAllocator *this_00;
  RALocalAllocator *pRVar10;
  RALocalAllocator *this_01;
  BaseRAPass *in_stack_fffffffffffffb70;
  RALocalAllocator *in_stack_fffffffffffffb78;
  BaseRAPass *in_stack_fffffffffffffb80;
  ArchTraits *local_460;
  RAAssignment *fromAssignment;
  undefined4 in_stack_fffffffffffffbb0;
  Error in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  uint in_stack_fffffffffffffbbc;
  BaseRAPass *in_stack_fffffffffffffbc0;
  BaseRAPass *this_02;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  Error in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  RALocalAllocator *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  ArchTraits *local_400;
  RALocalAllocator *local_3f8;
  ArchTraits *liveIn;
  ArchTraits *dstPhysToWorkMap;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 uVar11;
  RALocalAllocator *local_3b8;
  uint local_3ac;
  uint32_t local_3a8;
  RALocalAllocator local_3a0;
  Error local_294;
  long local_290;
  ArchTraits *local_288;
  ArchTraits *local_280;
  BaseRAPass *local_260;
  RALocalAllocator *local_258;
  long local_250;
  long local_248;
  ArchTraits *local_240;
  RALocalAllocator *local_238;
  RALocalAllocator *local_230;
  RALocalAllocator *local_228;
  ArchTraits *local_220;
  BaseRAPass *local_218;
  ArchTraits *local_210;
  ArchTraits *local_208;
  ArchTraits *local_200;
  RALocalAllocator *local_1f8;
  RALocalAllocator *local_1e0;
  RALocalAllocator *local_1d8;
  PhysToWorkMap **local_1d0;
  PhysToWorkMap **local_1c8;
  PhysToWorkMap **local_1c0;
  RALocalAllocator *local_1b8;
  PhysToWorkMap **local_1b0;
  uint **local_1a0;
  RALocalAllocator *local_198;
  RALocalAllocator *local_190;
  RALocalAllocator *local_188;
  ArchTraits *local_180;
  ArchTraits *local_178;
  RALocalAllocator *local_170;
  ArchTraits *local_168;
  RALocalAllocator *local_160;
  RALocalAllocator *local_158;
  RALocalAllocator *local_150;
  RALocalAllocator *local_148;
  RALocalAllocator *local_140;
  RALocalAllocator *local_138;
  PhysToWorkMap **local_130;
  PhysToWorkMap **local_128;
  RALocalAllocator *local_120;
  RALocalAllocator *local_118;
  RALocalAllocator *local_110;
  RALocalAllocator *local_108;
  RALocalAllocator *local_100;
  RALocalAllocator *local_f8;
  RALocalAllocator *local_f0;
  RALocalAllocator *local_e8;
  RALocalAllocator *local_e0;
  RALocalAllocator *local_d8;
  char *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  int line;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  
  line = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  fromAssignment = in_RDI;
  RALocalAllocator::RALocalAllocator(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  local_294 = RALocalAllocator::init(&local_3a0,(EVP_PKEY_CTX *)in_RDI);
  if (local_294 == 0) {
    local_1d0 = &fromAssignment[2]._physToWorkMap;
    if (*(int *)fromAssignment[2]._physToWorkIds._data == 0) {
      local_294 = 0;
    }
    else {
      local_1a0 = fromAssignment[2]._physToWorkIds._data + 3;
      local_3a8 = fromAssignment[3]._layout.physIndex.super_RARegCount.field_0._packed;
      local_3ac = 0;
      ppRVar7 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                          ((ZoneVector<asmjit::v1_14::RABlock_*> *)in_stack_fffffffffffffb48,
                           (size_t)in_stack_fffffffffffffb40);
      local_3b8 = (RALocalAllocator *)*ppRVar7;
      local_190 = local_3b8;
      bVar4 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                        (*(uint32_t *)((long)&local_3b8->_cc + 4),kIsReachable);
      if (!bVar4) {
        DebugUtils::assertionFailed
                  ((char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),line,
                   in_stack_ffffffffffffff30);
      }
      RALocalAllocator::makeInitialAssignment
                ((RALocalAllocator *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      local_294 = setBlockEntryAssignment
                            (in_stack_fffffffffffffbc0,
                             (RABlock *)
                             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                             (RABlock *)
                             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             fromAssignment);
      if (local_294 == 0) {
        uVar11 = 0;
LAB_00159388:
        this_00 = local_3b8;
        local_1f8 = local_3b8;
        dstPhysToWorkMap = local_3b8->_archTraits;
        local_188 = local_3b8;
        liveIn = *(ArchTraits **)(local_3b8->_availableRegs)._masks._data;
        local_160 = local_3b8;
        bVar4 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                          (*(uint32_t *)((long)&local_3b8->_cc + 4),kHasTerminator);
        local_460 = liveIn;
        if (!bVar4) {
          local_460 = (ArchTraits *)0x0;
        }
        lVar1 = *(long *)&dstPhysToWorkMap->_spRegId;
        pAVar2 = *(ArchTraits **)&liveIn->_minStackOffset;
        bVar4 = false;
        local_3f8 = (RALocalAllocator *)0x0;
        local_1b8 = local_3b8;
        local_1b0 = &(local_3b8->_curAssignment)._physToWorkMap;
        local_280 = liveIn;
        local_208 = dstPhysToWorkMap;
        if (*(int *)(local_3b8->_curAssignment)._physToWorkIds._data != 0) {
          local_1d8 = local_3b8;
          ppRVar7 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                              ((ZoneVector<asmjit::v1_14::RABlock_*> *)in_stack_fffffffffffffb48,
                               (size_t)in_stack_fffffffffffffb40);
          local_3f8 = (RALocalAllocator *)*ppRVar7;
        }
        local_150 = &local_3a0;
        local_158 = local_3b8;
        local_3a0._block = (RABlock *)local_3b8;
        local_148 = local_3b8;
        puVar8 = (uint32_t *)((long)&local_3b8->_cc + 4);
        *puVar8 = *puVar8 | 8;
        pAVar3 = dstPhysToWorkMap;
LAB_00159594:
        do {
          local_400 = pAVar3;
          if (local_400 == pAVar2) goto LAB_001599b9;
          local_288 = local_400;
          pAVar3 = *(ArchTraits **)&local_400->_minStackOffset;
          local_180 = local_400;
          bVar5 = Support::test<asmjit::v1_14::NodeFlags,asmjit::v1_14::NodeFlags>
                            ((local_400->_instHints)._data[1],kActsAsInst);
          if (bVar5) {
            local_178 = local_400;
            if (local_400 == local_460) {
              local_1e0 = local_3b8;
              ppPVar9 = &(local_3b8->_curAssignment)._physToWorkMap;
              local_138 = local_3b8;
              bVar5 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                                (*(uint32_t *)((long)&local_3b8->_cc + 4),kHasConsecutive);
              if (bVar5) {
                ZoneVector<asmjit::v1_14::RABlock_*>::last
                          ((ZoneVector<asmjit::v1_14::RABlock_*> *)0x1596e5);
                local_128 = ppPVar9;
                ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                          ((ZoneVector<asmjit::v1_14::RABlock_*> *)in_stack_fffffffffffffb48,
                           (size_t)in_stack_fffffffffffffb40);
                EVar6 = RALocalAllocator::allocBranch
                                  ((RALocalAllocator *)
                                   CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                   (InstNode *)in_stack_fffffffffffffbd8,
                                   (RABlock *)
                                   CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                                   (RABlock *)
                                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
                if (EVar6 != 0) {
                  return EVar6;
                }
                in_stack_fffffffffffffbe4 = 0;
                goto LAB_00159594;
              }
              local_1c0 = ppPVar9;
              if (1 < *(uint *)(local_3b8->_curAssignment)._physToWorkIds._data) {
                local_140 = local_3b8;
                bVar5 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                                  (*(uint32_t *)((long)&local_3b8->_cc + 4),kHasConsecutive);
                if (bVar5) {
                  local_130 = ppPVar9;
                  ppRVar7 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                                      ((ZoneVector<asmjit::v1_14::RABlock_*> *)
                                       in_stack_fffffffffffffb48,(size_t)in_stack_fffffffffffffb40);
                  in_stack_fffffffffffffbd8 = (RALocalAllocator *)*ppRVar7;
                }
                else {
                  in_stack_fffffffffffffbd8 = (RALocalAllocator *)0x0;
                }
                EVar6 = RALocalAllocator::allocJumpTable
                                  (in_stack_fffffffffffffbd8,(InstNode *)in_stack_fffffffffffffb80,
                                   (RABlocks *)in_stack_fffffffffffffb78,
                                   (RABlock *)in_stack_fffffffffffffb70);
                if (EVar6 != 0) {
                  return EVar6;
                }
                in_stack_fffffffffffffbd4 = 0;
                goto LAB_00159594;
              }
              bVar4 = true;
            }
            in_stack_fffffffffffffbd0 =
                 RALocalAllocator::allocInst(in_stack_00000048,in_stack_00000040);
            if (in_stack_fffffffffffffbd0 != 0) {
              return in_stack_fffffffffffffbd0;
            }
            local_200 = local_400;
            if ((local_400->_instHints)._data[0] == 0x12) {
              local_168 = local_400;
              EVar6 = (**(code **)(*(long *)&fromAssignment->_layout + 0x70))
                                (fromAssignment,local_400);
              if (EVar6 != 0) {
                return EVar6;
              }
              in_stack_fffffffffffffbcc = 0;
            }
            else {
              EVar6 = RALocalAllocator::spillAfterAllocation
                                (in_stack_fffffffffffffb78,(InstNode *)in_stack_fffffffffffffb70);
              if (EVar6 != 0) {
                return EVar6;
              }
              in_stack_fffffffffffffbc8 = 0;
            }
          }
        } while( true );
      }
    }
  }
  return local_294;
LAB_001599b9:
  if (local_3f8 != (RALocalAllocator *)0x0) {
    if (pAVar2 == (ArchTraits *)0x0) {
      local_248 = *(long *)&(fromAssignment->_layout).physTotal;
      in_stack_fffffffffffffb80 = *(BaseRAPass **)(local_248 + 0x1a8);
    }
    else {
      in_stack_fffffffffffffb80 = *(BaseRAPass **)&pAVar2->_spRegId;
      local_210 = pAVar2;
    }
    in_stack_fffffffffffffb78 = *(RALocalAllocator **)&(fromAssignment->_layout).physTotal;
    in_stack_fffffffffffffb70 = in_stack_fffffffffffffb80;
    if (bVar4) {
      in_stack_fffffffffffffb70 =
           (BaseRAPass *)(in_stack_fffffffffffffb80->super_FuncPass).super_Pass._vptr_Pass;
      local_218 = in_stack_fffffffffffffb80;
    }
    *(BaseRAPass **)&in_stack_fffffffffffffb78[1]._tmpAssignment._layout.physTotal =
         in_stack_fffffffffffffb70;
    local_118 = local_3f8;
    local_260 = in_stack_fffffffffffffb70;
    local_258 = in_stack_fffffffffffffb78;
    if ((local_3f8->_tmpAssignment)._physToWorkIds._data[2] == (uint *)0x0) {
      pRVar10 = &local_3a0;
      local_e0 = local_3f8;
      this_01 = local_3f8;
      this_02 = in_stack_fffffffffffffb80;
      local_d8 = pRVar10;
      if (*(int *)(local_3f8->_tmpAssignment)._physToWorkIds._data != -1) {
        ZoneVector<asmjit::v1_14::RASharedAssignment>::operator[]
                  ((ZoneVector<asmjit::v1_14::RASharedAssignment> *)in_stack_fffffffffffffb48,
                   (size_t)in_stack_fffffffffffffb40);
      }
      EVar6 = RALocalAllocator::spillScratchGpRegsBeforeEntry
                        (this_01,(RegMask)((ulong)pRVar10 >> 0x20));
      if (EVar6 != 0) {
        return EVar6;
      }
      in_stack_fffffffffffffbb4 =
           setBlockEntryAssignment
                     (this_02,(RABlock *)((ulong)in_stack_fffffffffffffbbc << 0x20),
                      (RABlock *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                      fromAssignment);
      if (in_stack_fffffffffffffbb4 != 0) {
        return in_stack_fffffffffffffbb4;
      }
      local_108 = local_3f8;
      RAAssignment::copyFrom
                ((RAAssignment *)in_stack_fffffffffffffb48,
                 (PhysToWorkMap *)in_stack_fffffffffffffb40);
    }
    else {
      local_100 = local_3f8;
      local_170 = local_3f8;
      local_e8 = local_3f8;
      Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                (*(uint32_t *)((long)&local_3f8->_cc + 4),kIsAllocated);
      EVar6 = RALocalAllocator::switchToAssignment
                        ((RALocalAllocator *)CONCAT44(uVar11,in_stack_fffffffffffffc40),
                         (PhysToWorkMap *)dstPhysToWorkMap,(ZoneBitVector *)liveIn,
                         SUB81((ulong)local_460 >> 0x38,0),SUB81((ulong)local_460 >> 0x30,0));
      if (EVar6 != 0) {
        return EVar6;
      }
      in_stack_fffffffffffffbbc = 0;
    }
  }
  local_240 = *(ArchTraits **)(lVar1 + 8);
  local_238 = local_3b8;
  local_3b8->_archTraits = local_240;
  if (pAVar2 == (ArchTraits *)0x0) {
    local_250 = *(long *)&(fromAssignment->_layout).physTotal;
    in_stack_fffffffffffffb40 = *(RALocalAllocator **)(local_250 + 0x1a8);
  }
  else {
    in_stack_fffffffffffffb40 = *(RALocalAllocator **)&pAVar2->_spRegId;
    local_220 = pAVar2;
  }
  local_228 = local_3b8;
  *(RALocalAllocator **)(local_3b8->_availableRegs)._masks._data = in_stack_fffffffffffffb40;
  local_3a8 = local_3a8 - 1;
  local_290 = lVar1;
  local_230 = in_stack_fffffffffffffb40;
  if (local_3a8 == 0) {
    RARegMask::op<asmjit::v1_14::Support::Or>
              ((RARegMask *)in_stack_fffffffffffffb40,(RARegMask *)in_stack_fffffffffffffb38);
    return 0;
  }
  if (local_3f8 != (RALocalAllocator *)0x0) {
    local_3b8 = local_3f8;
    local_f0 = local_3f8;
    bVar4 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                      (*(uint32_t *)((long)&local_3f8->_cc + 4),kIsAllocated);
    in_stack_fffffffffffffb48 = this_00;
    if (!bVar4) goto LAB_00159388;
  }
  do {
    local_3ac = local_3ac + 1;
    local_1c8 = &fromAssignment[2]._physToWorkMap;
    if (*(uint *)fromAssignment[2]._physToWorkIds._data <= local_3ac) {
      local_3ac = 0;
    }
    ppRVar7 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                        ((ZoneVector<asmjit::v1_14::RABlock_*> *)this_00,
                         (size_t)in_stack_fffffffffffffb40);
    local_3b8 = (RALocalAllocator *)*ppRVar7;
    local_198 = local_3b8;
    bVar4 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                      (*(uint32_t *)((long)&local_3b8->_cc + 4),kIsReachable);
  } while (((!bVar4) ||
           (local_f8 = local_3b8,
           bVar4 = Support::test<asmjit::v1_14::RABlockFlags,asmjit::v1_14::RABlockFlags>
                             (*(uint32_t *)((long)&local_3b8->_cc + 4),kIsAllocated), bVar4)) ||
          (local_120 = local_3b8, (local_3b8->_tmpAssignment)._physToWorkIds._data[2] == (uint *)0x0
          ));
  local_110 = local_3b8;
  RALocalAllocator::replaceAssignment
            (in_stack_fffffffffffffb40,(PhysToWorkMap *)in_stack_fffffffffffffb38);
  in_stack_fffffffffffffb48 = this_00;
  goto LAB_00159388;
}

Assistant:

Error BaseRAPass::runLocalAllocator() noexcept {
  RALocalAllocator lra(this);
  ASMJIT_PROPAGATE(lra.init());

  if (!blockCount())
    return kErrorOk;

  // The allocation is done when this reaches zero.
  uint32_t blocksRemaining = reachableBlockCount();

  // Current block.
  uint32_t blockId = 0;
  RABlock* block = _blocks[blockId];

  // The first block (entry) must always be reachable.
  ASMJIT_ASSERT(block->isReachable());

  // Assign function arguments for the initial block. The `lra` is valid now.
  lra.makeInitialAssignment();
  ASMJIT_PROPAGATE(setBlockEntryAssignment(block, block, lra._curAssignment));

  // The loop starts from the first block and iterates blocks in order, however, the algorithm also allows to jump to
  // any other block when finished if it's a jump target. In-order iteration just makes sure that all blocks are visited.
  for (;;) {
    BaseNode* first = block->first();
    BaseNode* last = block->last();
    BaseNode* terminator = block->hasTerminator() ? last : nullptr;

    BaseNode* beforeFirst = first->prev();
    BaseNode* afterLast = last->next();

    bool unconditionalJump = false;
    RABlock* consecutive = nullptr;

    if (block->hasSuccessors())
      consecutive = block->successors()[0];

    lra.setBlock(block);
    block->makeAllocated();

    BaseNode* node = first;
    while (node != afterLast) {
      BaseNode* next = node->next();
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();

        if (ASMJIT_UNLIKELY(inst == terminator)) {
          const RABlocks& successors = block->successors();
          if (block->hasConsecutive()) {
            ASMJIT_PROPAGATE(lra.allocBranch(inst, successors.last(), successors.first()));

            node = next;
            continue;
          }
          else if (successors.size() > 1) {
            RABlock* cont = block->hasConsecutive() ? successors.first() : nullptr;
            ASMJIT_PROPAGATE(lra.allocJumpTable(inst, successors, cont));

            node = next;
            continue;
          }
          else {
            // Otherwise this is an unconditional jump, special handling isn't required.
            unconditionalJump = true;
          }
        }

        ASMJIT_PROPAGATE(lra.allocInst(inst));
        if (inst->type() == NodeType::kInvoke)
          ASMJIT_PROPAGATE(emitPreCall(inst->as<InvokeNode>()));
        else
          ASMJIT_PROPAGATE(lra.spillAfterAllocation(inst));
      }
      node = next;
    }

    if (consecutive) {
      BaseNode* prev = afterLast ? afterLast->prev() : cc()->lastNode();
      cc()->_setCursor(unconditionalJump ? prev->prev() : prev);

      if (consecutive->hasEntryAssignment()) {
        ASMJIT_PROPAGATE(lra.switchToAssignment(consecutive->entryPhysToWorkMap(), consecutive->liveIn(), consecutive->isAllocated(), false));
      }
      else {
        ASMJIT_PROPAGATE(lra.spillRegsBeforeEntry(consecutive));
        ASMJIT_PROPAGATE(setBlockEntryAssignment(consecutive, block, lra._curAssignment));
        lra._curAssignment.copyFrom(consecutive->entryPhysToWorkMap());
      }
    }

    // Important as the local allocator can insert instructions before
    // and after any instruction within the basic block.
    block->setFirst(beforeFirst->next());
    block->setLast(afterLast ? afterLast->prev() : cc()->lastNode());

    if (--blocksRemaining == 0)
      break;

    // Switch to the next consecutive block, if any.
    if (consecutive) {
      block = consecutive;
      if (!block->isAllocated())
        continue;
    }

    // Get the next block.
    for (;;) {
      if (++blockId >= blockCount())
        blockId = 0;

      block = _blocks[blockId];
      if (!block->isReachable() || block->isAllocated() || !block->hasEntryAssignment())
        continue;

      break;
    }

    // If we switched to some block we have to update the local allocator.
    lra.replaceAssignment(block->entryPhysToWorkMap());
  }

  _clobberedRegs.op<Support::Or>(lra._clobberedRegs);
  return kErrorOk;
}